

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O2

int amqp_raw_equal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    cVar3 = first[lVar5];
    cVar4 = second[lVar5];
    if ((cVar3 == '\0') || (cVar4 == '\0')) break;
    cVar1 = amqp_raw_toupper(cVar3);
    cVar2 = amqp_raw_toupper(cVar4);
    if (cVar1 != cVar2) break;
    lVar5 = lVar5 + 1;
  }
  cVar3 = amqp_raw_toupper(cVar3);
  cVar4 = amqp_raw_toupper(cVar4);
  return (int)(cVar3 == cVar4);
}

Assistant:

static int
amqp_raw_equal(const char *first, const char *second)
{
  while (*first && *second) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      /* get out of the loop as soon as they don't match */
      break;
    }
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if
   * the loop above is skipped because one of the strings reached zero, we
   * must not return this as a successful match
   */
  return (amqp_raw_toupper(*first) == amqp_raw_toupper(*second));
}